

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

int * __thiscall kj::_::NullableValue<int>::emplace<int>(NullableValue<int> *this,int *params)

{
  int *params_00;
  int *params_local;
  NullableValue<int> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<int>(&(this->field_1).value);
  }
  params_00 = fwd<int>(params);
  ctor<int,int>(&(this->field_1).value,params_00);
  this->isSet = true;
  return (int *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }